

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.cpp
# Opt level: O2

void anon_unknown.dwarf_1ee2ad::InitPanning(ALCdevice *device,bool hqdec,bool stablize)

{
  uint uVar1;
  bool bVar2;
  __uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_> _Var3;
  bool bVar4;
  ALuint o_1;
  ALuint AVar5;
  ulong uVar6;
  pointer paVar7;
  undefined1 *puVar8;
  array<unsigned_char,_16UL> *paVar9;
  ALuint o;
  ulong uVar10;
  array<float,_16UL> *paVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  array<float,_16UL> *paVar17;
  size_t main_chans;
  long lVar18;
  BFChannelConfig BVar19;
  long lVar20;
  long lVar21;
  undefined *puVar22;
  long lVar23;
  pointer main_chans_00;
  span<const_std::array<float,_16UL>,_18446744073709551615UL> coeffs;
  span<const_std::array<float,_16UL>,_18446744073709551615UL> coeffslf;
  ALuint AStack_110;
  char *local_f8;
  __uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_> local_e0;
  vector<ChannelDec> chancoeffslf;
  vector<ChannelDec> chancoeffs;
  unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> local_90;
  unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> stablizer;
  
  lVar16 = 0;
  AStack_110 = 2;
  switch(device->FmtChans) {
  case DevFmtMono:
    local_f8 = "first";
    lVar21 = 0x1883f8;
    lVar23 = 0x1883e8;
    lVar18 = 0x1883e4;
    puVar22 = (undefined *)0x0;
    puVar8 = (undefined *)0x0;
    AStack_110 = (ALuint)device->FmtChans;
    break;
  case DevFmtChannelsDefault:
    local_f8 = "first";
    AStack_110 = 1;
    lVar21 = 0x188430;
    lVar23 = 0x188420;
    lVar18 = 0x188418;
    lVar16 = 0;
    puVar22 = (undefined *)0x0;
    puVar8 = (undefined *)0x0;
    break;
  case DevFmtQuad:
    puVar8 = (anonymous_namespace)::X51Config;
    puVar22 = (undefined *)0x18850c;
    lVar16 = 0x1884fc;
    lVar21 = 0x18848c;
    lVar23 = 0x18847c;
    lVar18 = 0x18846c;
    goto LAB_0015355a;
  case DevFmtX51:
    lVar21 = 0x1885a0;
    lVar23 = 0x188590;
    lVar18 = 0x188580;
    goto LAB_00153553;
  case DevFmtX61:
    lVar21 = 0x1886cc;
    lVar23 = 0x1886bc;
    lVar18 = 0x1886a8;
    goto LAB_00153553;
  case DevFmtX71:
    AStack_110 = 3;
    local_f8 = "third";
    puVar8 = &DAT_001888e4;
    puVar22 = (undefined *)0x18883c;
    lVar16 = 0x18882c;
    lVar21 = 0x188784;
    lVar23 = 0x188774;
    lVar18 = 0x18875c;
    break;
  case DevFmtAmbi3D:
    paVar9 = &AmbiIndex::FromFuMa;
    if (device->mAmbiLayout != FuMa) {
      paVar9 = &AmbiIndex::FromACN;
    }
    pcVar13 = (device->DeviceName)._M_dataplus._M_p;
    paVar17 = &AmbiScale::FromN3D;
    if (device->mAmbiScale == Default) {
      paVar17 = &AmbiScale::FromSN3D;
    }
    paVar11 = &AmbiScale::FromFuMa;
    if (device->mAmbiScale != FuMa) {
      paVar11 = paVar17;
    }
    lVar16 = (ulong)device->mAmbiOrder + 1;
    main_chans = lVar16 * lVar16;
    for (lVar16 = 0; main_chans - lVar16 != 0; lVar16 = lVar16 + 1) {
      BVar19.Index._0_1_ = paVar9->_M_elems[lVar16];
      BVar19.Scale = 1.0 / paVar11->_M_elems[paVar9->_M_elems[lVar16]];
      BVar19.Index._1_3_ = 0;
      (device->Dry).AmbiMap._M_elems[lVar16] = BVar19;
    }
    AllocChannels(device,main_chans,0);
    ConfigValueFloat((char *)&stablizer,pcVar13,"decoder");
    if ((char)stablizer._M_t.
              super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>._M_t.
              super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
              super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl == '\0') {
      stablizer._M_t.super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>.
      _M_t.super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
      super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl._4_4_ = 0.0;
    }
    else {
    }
    if (stablizer._M_t.super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>.
        _M_t.super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
        super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl._4_4_ <= 0.0) {
      return;
    }
    InitNearFieldCtrl(device,stablizer._M_t.
                             super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>
                             .super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl._4_4_ *
                             343.3,device->mAmbiOrder,true);
    return;
  case DevFmtX51Rear:
    lVar21 = 0x188634;
    lVar23 = 0x188624;
    lVar18 = 0x188614;
LAB_00153553:
    lVar16 = 0;
    puVar22 = (undefined *)0x0;
    puVar8 = (undefined *)0x0;
LAB_0015355a:
    local_f8 = "second";
    break;
  default:
    local_f8 = "first";
    lVar18 = 0;
    lVar23 = 0;
    lVar21 = 0;
    puVar22 = (undefined *)0x0;
    puVar8 = (undefined *)0x0;
    AStack_110 = 0;
  }
  bVar4 = puVar22 != puVar8 && hqdec;
  chancoeffs.
  super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  chancoeffs.
  super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  chancoeffs.
  super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  chancoeffslf.
  super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  chancoeffslf.
  super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  chancoeffslf.
  super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar20 = 0; lVar20 != lVar23 - lVar18 >> 2; lVar20 = lVar20 + 1) {
    uVar1 = *(uint *)(lVar18 + lVar20 * 4);
    uVar10 = (ulong)(device->RealOut).ChannelIndex._M_elems[uVar1];
    if (uVar10 == 0xffffffff) {
      if (0 < (int)gLogLevel) {
        pcVar13 = "(unknown)";
        if (uVar1 < 0x10) {
          pcVar13 = &DAT_00189040 + *(int *)(&DAT_00189040 + (ulong)uVar1 * 4);
        }
        fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Failed to find %s channel in device\n",pcVar13);
      }
    }
    else {
      uVar14 = (long)chancoeffs.
                     super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)chancoeffs.
                     super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 6;
      uVar6 = uVar10 + 1;
      if (uVar14 <= uVar6) {
        uVar14 = uVar6;
      }
      stablizer._M_t.super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>.
      _M_t.super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
      super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl =
           (__uniq_ptr_data<FrontStablizer,_std::default_delete<FrontStablizer>,_true,_true>)
           (__uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>)0x0;
      std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::resize
                (&chancoeffs,uVar14,(value_type *)&stablizer);
      lVar12 = 0;
      for (uVar14 = 0; uVar14 != AStack_110 + 1; uVar14 = uVar14 + 1) {
        lVar15 = 2 - (ulong)(uVar14 == 0);
        do {
          chancoeffs.
          super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar10]._M_elems[lVar12] =
               *(float *)(lVar21 + lVar12 * 4) * *(float *)(lVar23 + uVar14 * 4);
          lVar12 = lVar12 + 1;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      if (bVar4) {
        uVar14 = (long)chancoeffslf.
                       super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)chancoeffslf.
                       super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6;
        if (uVar14 <= uVar6) {
          uVar14 = uVar6;
        }
        stablizer._M_t.super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>.
        _M_t.super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
        super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl =
             (__uniq_ptr_data<FrontStablizer,_std::default_delete<FrontStablizer>,_true,_true>)
             (__uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>)0x0;
        std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::resize
                  (&chancoeffslf,uVar14,(value_type *)&stablizer);
        lVar12 = 0;
        for (uVar6 = 0; uVar6 != AStack_110 + 1; uVar6 = uVar6 + 1) {
          lVar15 = 2 - (ulong)(uVar6 == 0);
          do {
            chancoeffslf.
            super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_elems[lVar12] =
                 *(float *)(puVar22 + lVar12 * 4) * *(float *)(lVar16 + uVar6 * 4);
            lVar12 = lVar12 + 1;
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
        }
      }
    }
    lVar21 = lVar21 + 0x1c;
    puVar22 = puVar22 + 0x1c;
  }
  device->mAmbiOrder = AStack_110;
  main_chans_00 = (pointer)(ulong)(AStack_110 * 2 + 1);
  for (paVar7 = (pointer)0x0; main_chans_00 != paVar7;
      paVar7 = (pointer)((long)paVar7->_M_elems + 1)) {
    (device->Dry).AmbiMap._M_elems[(long)paVar7] =
         (BFChannelConfig)
         ((ulong)*(byte *)((long)paVar7[0x620e]._M_elems + 0x3f) << 0x20 | 0x3f800000);
  }
  AVar5 = ALCdevice::channelsFromFmt(device);
  AllocChannels(device,(size_t)main_chans_00,(ulong)AVar5);
  stablizer._M_t.super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>._M_t.
  super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
  super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl =
       (__uniq_ptr_data<FrontStablizer,_std::default_delete<FrontStablizer>,_true,_true>)
       (__uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>)0x0;
  if (stablize) {
    uVar10 = (ulong)(device->RealOut).ChannelIndex._M_elems[2];
    if (uVar10 < (ulong)((long)chancoeffs.
                               super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)chancoeffs.
                               super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 6)) {
      bVar2 = false;
      for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 4) {
        bVar2 = (bool)(bVar2 | *(float *)((long)chancoeffs.
                                                super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                                _M_elems + lVar16) != 0.0);
      }
      if (!bVar2) goto LAB_00153850;
    }
    else {
      bVar2 = false;
LAB_00153850:
      if (uVar10 < (ulong)((long)chancoeffslf.
                                 super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)chancoeffslf.
                                 super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 6)) {
        for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 4) {
          bVar2 = (bool)(bVar2 | *(float *)((long)chancoeffslf.
                                                  super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                                  _M_elems + lVar16) != 0.0);
        }
      }
    }
    if (!bVar2) {
      AVar5 = ALCdevice::channelsFromFmt(device);
      CreateStablizer((size_t)&local_e0,AVar5);
      _Var3._M_t.super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
      super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl =
           local_e0._M_t.
           super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
           super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl;
      local_e0._M_t.super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
      super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl =
           (tuple<FrontStablizer_*,_std::default_delete<FrontStablizer>_>)
           (_Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>)0x0;
      std::__uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>::reset
                ((__uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_> *)&stablizer
                 ,(pointer)_Var3._M_t.
                           super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>
                           .super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl);
      std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::~unique_ptr
                ((unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)&local_e0);
      if ((int)gLogLevel < 3) goto LAB_00153924;
      fwrite("[ALSOFT] (II) Front stablizer enabled\n",0x26,1,(FILE *)gLogFile);
    }
  }
  if (2 < (int)gLogLevel) {
    pcVar13 = "single";
    if (bVar4) {
      pcVar13 = "dual";
    }
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Enabling %s-band %s-order%s ambisonic decoder\n",pcVar13
            ,local_f8,0x18a6a5);
  }
LAB_00153924:
  local_90 = (unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>)
             (unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>)
             stablizer._M_t.
             super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>._M_t.
             super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
             super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl;
  stablizer._M_t.super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>._M_t.
  super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
  super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl =
       (__uniq_ptr_data<FrontStablizer,_std::default_delete<FrontStablizer>,_true,_true>)
       (__uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>)0x0;
  coeffs.mDataEnd =
       chancoeffs.
       super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>.
       _M_impl.super__Vector_impl_data._M_start;
  coeffs.mData = main_chans_00;
  coeffslf.mDataEnd =
       chancoeffslf.
       super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>.
       _M_impl.super__Vector_impl_data._M_start;
  coeffslf.mData =
       chancoeffs.
       super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  BFormatDec::Create((size_t)&local_e0,coeffs,coeffslf,
                     (unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)
                     chancoeffslf.
                     super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  _Var3._M_t.super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
  super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl =
       local_e0._M_t.super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
       super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl;
  local_e0._M_t.super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
  super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl =
       (tuple<FrontStablizer_*,_std::default_delete<FrontStablizer>_>)
       (_Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>)0x0;
  std::__uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>::reset
            ((__uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_> *)&device->AmbiDecoder,
             (pointer)_Var3._M_t.
                      super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>
                      .super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl);
  std::unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_>::~unique_ptr
            ((unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_> *)&local_e0);
  std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::~unique_ptr(&local_90);
  std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::~unique_ptr(&stablizer);
  std::_Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::
  ~_Vector_base(&chancoeffslf.
                 super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
               );
  std::_Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::
  ~_Vector_base(&chancoeffs.
                 super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
               );
  return;
}

Assistant:

void InitPanning(ALCdevice *device, const bool hqdec=false, const bool stablize=false)
{
    DecoderView decoder{};
    switch(device->FmtChans)
    {
    case DevFmtMono:
        decoder = MonoConfig;
        break;
    case DevFmtStereo:
        decoder = StereoConfig;
        break;
    case DevFmtQuad:
        decoder = QuadConfig;
        break;
    case DevFmtX51:
        decoder = X51Config;
        break;
    case DevFmtX51Rear:
        decoder = X51RearConfig;
        break;
    case DevFmtX61:
        decoder = X61Config;
        break;
    case DevFmtX71:
        decoder = X71Config;
        break;
    case DevFmtAmbi3D:
        break;
    }

    if(device->FmtChans == DevFmtAmbi3D)
    {
        const char *devname{device->DeviceName.c_str()};
        const std::array<uint8_t,MAX_AMBI_CHANNELS> &acnmap = GetAmbiLayout(device->mAmbiLayout);
        const std::array<float,MAX_AMBI_CHANNELS> &n3dscale = GetAmbiScales(device->mAmbiScale);

        /* For DevFmtAmbi3D, the ambisonic order is already set. */
        const size_t count{AmbiChannelsFromOrder(device->mAmbiOrder)};
        std::transform(acnmap.begin(), acnmap.begin()+count, std::begin(device->Dry.AmbiMap),
            [&n3dscale](const uint8_t &acn) noexcept -> BFChannelConfig
            { return BFChannelConfig{1.0f/n3dscale[acn], acn}; }
        );
        AllocChannels(device, count, 0);

        float nfc_delay{ConfigValueFloat(devname, "decoder", "nfc-ref-delay").value_or(0.0f)};
        if(nfc_delay > 0.0f)
            InitNearFieldCtrl(device, nfc_delay * SpeedOfSoundMetersPerSec, device->mAmbiOrder,
                true);
    }
    else
    {
        const bool dual_band{hqdec && !decoder.mCoeffsLF.empty()};
        al::vector<ChannelDec> chancoeffs, chancoeffslf;
        for(size_t i{0u};i < decoder.mChannels.size();++i)
        {
            const ALuint idx{GetChannelIdxByName(device->RealOut, decoder.mChannels[i])};
            if(idx == INVALID_CHANNEL_INDEX)
            {
                ERR("Failed to find %s channel in device\n",
                    GetLabelFromChannel(decoder.mChannels[i]));
                continue;
            }

            chancoeffs.resize(maxz(chancoeffs.size(), idx+1u), ChannelDec{});
            al::span<float,MAX_AMBI_CHANNELS> coeffs{chancoeffs[idx]};
            size_t start{0};
            for(ALuint o{0};o <= decoder.mOrder;++o)
            {
                size_t count{o ? 2u : 1u};
                do {
                    coeffs[start] = decoder.mCoeffs[i][start] * decoder.mOrderGain[o];
                    ++start;
                } while(--count);
            }
            if(!dual_band)
                continue;

            chancoeffslf.resize(maxz(chancoeffslf.size(), idx+1u), ChannelDec{});
            coeffs = chancoeffslf[idx];
            start = 0;
            for(ALuint o{0};o <= decoder.mOrder;++o)
            {
                size_t count{o ? 2u : 1u};
                do {
                    coeffs[start] = decoder.mCoeffsLF[i][start] * decoder.mOrderGainLF[o];
                    ++start;
                } while(--count);
            }
        }

        /* For non-DevFmtAmbi3D, set the ambisonic order. */
        device->mAmbiOrder = decoder.mOrder;

        /* Built-in speaker decoders are always 2D. */
        const size_t ambicount{Ambi2DChannelsFromOrder(decoder.mOrder)};
        std::transform(AmbiIndex::From2D.begin(), AmbiIndex::From2D.begin()+ambicount,
            std::begin(device->Dry.AmbiMap),
            [](const uint8_t &index) noexcept { return BFChannelConfig{1.0f, index}; }
        );
        AllocChannels(device, ambicount, device->channelsFromFmt());

        std::unique_ptr<FrontStablizer> stablizer;
        if(stablize)
        {
            /* Only enable the stablizer if the decoder does not output to the
             * front-center channel.
             */
            const auto cidx = device->RealOut.ChannelIndex[FrontCenter];
            bool hasfc{false};
            if(cidx < chancoeffs.size())
            {
                for(const auto &coeff : chancoeffs[cidx])
                    hasfc |= coeff != 0.0f;
            }
            if(!hasfc && cidx < chancoeffslf.size())
            {
                for(const auto &coeff : chancoeffslf[cidx])
                    hasfc |= coeff != 0.0f;
            }
            if(!hasfc)
            {
                stablizer = CreateStablizer(device->channelsFromFmt(), device->Frequency);
                TRACE("Front stablizer enabled\n");
            }
        }

        TRACE("Enabling %s-band %s-order%s ambisonic decoder\n",
            !dual_band ? "single" : "dual",
            (decoder.mOrder > 2) ? "third" :
            (decoder.mOrder > 1) ? "second" : "first",
            "");
        device->AmbiDecoder = BFormatDec::Create(ambicount, chancoeffs, chancoeffslf,
            std::move(stablizer));
    }
}